

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O3

vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_> *
ExprEval::Operator::get_custom_table(void)

{
  CustomOperator operator_id;
  CustomOperator operator_sqrt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 local_160 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  vector<int,_std::allocator<int>_> vStack_120;
  _Alloc_hider local_108;
  char *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined1 local_c8 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  vector<int,_std::allocator<int>_> vStack_88;
  _Alloc_hider local_70;
  char *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (custom_operator_table ==
      (vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
       *)0x0) {
    custom_operator_table =
         (vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
          *)operator_new(0x18);
    (custom_operator_table->
    super__Vector_base<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (custom_operator_table->
    super__Vector_base<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (custom_operator_table->
    super__Vector_base<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8._0_8_ = &PTR__CustomOperator_00115cd0;
    local_c8._8_8_ = local_c8 + 0x18;
    local_c8._16_8_ = 0;
    local_c8[0x18] = '\0';
    local_a0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    vStack_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (int *)0x0;
    vStack_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    local_68 = (char *)0x0;
    local_60._M_local_buf[0] = '\0';
    local_50._M_p = (pointer)&local_40;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_70._M_p = (pointer)&local_60;
    std::__cxx11::string::_M_replace((ulong)(local_c8 + 8),0,(char *)0x0,0x11161b);
    local_160._0_8_ = local_160 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"var","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160);
    if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
      operator_delete((void *)local_160._0_8_);
    }
    local_160._0_4_ = 1;
    if (vStack_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        vStack_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&vStack_88,
                 (iterator)
                 vStack_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)local_160);
    }
    else {
      *vStack_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = 1;
      vStack_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = vStack_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    std::__cxx11::string::_M_replace((ulong)&local_70,0,local_68,0x111624);
    local_160._0_8_ = &PTR__CustomOperator_00115cd0;
    local_160._16_8_ = 0;
    local_148._M_local_buf[0] = '\0';
    local_138.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    vStack_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (int *)0x0;
    vStack_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    local_100 = (char *)0x0;
    local_f8._M_local_buf[0] = '\0';
    local_e0 = 0;
    local_d8._M_local_buf[0] = '\0';
    local_160._8_8_ = &local_148;
    local_108._M_p = (pointer)&local_f8;
    local_e8._M_p = (pointer)&local_d8;
    std::__cxx11::string::_M_replace((ulong)(local_160 + 8),0,(char *)0x0,0x1112ad);
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"x","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_138,
               &local_180);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p);
    }
    local_180._M_dataplus._M_p._0_4_ = 1;
    if (vStack_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        vStack_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&vStack_120,
                 (iterator)
                 vStack_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_180);
    }
    else {
      *vStack_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = 1;
      vStack_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = vStack_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    std::__cxx11::string::_M_replace((ulong)&local_108,0,local_100,0x11162c);
    std::
    vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
    ::push_back(custom_operator_table,(value_type *)local_c8);
    std::
    vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
    ::push_back(custom_operator_table,(value_type *)local_160);
    local_160._0_8_ = &PTR__CustomOperator_00115cd0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_p != &local_d8) {
      operator_delete(local_e8._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_p != &local_f8) {
      operator_delete(local_108._M_p);
    }
    if (vStack_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(vStack_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._8_8_ != &local_148) {
      operator_delete((void *)local_160._8_8_);
    }
    local_c8._0_8_ = &PTR__CustomOperator_00115cd0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p);
    }
    if (vStack_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(vStack_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a0);
    if ((undefined1 *)local_c8._8_8_ != local_c8 + 0x18) {
      operator_delete((void *)local_c8._8_8_);
    }
  }
  return custom_operator_table;
}

Assistant:

const std::vector<Operator::CustomOperator>* get_custom_table(){
            if(!custom_operator_table){
                custom_operator_table = new std::vector<Operator::CustomOperator>;

                CustomOperator operator_sqrt;
                operator_sqrt.symbol = "sqrt";
                operator_sqrt.variables.push_back("var");
                operator_sqrt.arg_positions.push_back(1);
                operator_sqrt.expression = "var^0.5";

                CustomOperator operator_id;
                operator_id.symbol = "id";
                operator_id.variables.push_back("x");
                operator_id.arg_positions.push_back(1);
                operator_id.expression = "x";

                custom_operator_table->push_back(operator_sqrt);
                custom_operator_table->push_back(operator_id);
            }
            return custom_operator_table;
        }